

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolDefinitionInlining.cpp
# Opt level: O2

void __thiscall
SymbolDefinitionInlining::collectBoundVariables(SymbolDefinitionInlining *this,Formula *formula)

{
  Formula *formula_00;
  long lVar1;
  undefined8 *puVar2;
  
  do {
    lVar1 = 0x28;
    switch(formula->_connective) {
    case LITERAL:
      collectBoundVariables(this,*(Term **)(formula + 1));
      return;
    case AND:
    case OR:
      puVar2 = *(undefined8 **)(formula + 1);
      while (puVar2 != (undefined8 *)0x0) {
        formula_00 = (Formula *)*puVar2;
        puVar2 = (undefined8 *)puVar2[1];
        collectBoundVariables(this,formula_00);
      }
      return;
    case IMP:
    case IFF:
    case XOR:
      collectBoundVariables(this,*(Formula **)(formula + 1));
      lVar1 = 0x30;
switchD_00623451_caseD_6:
      formula = *(Formula **)((long)&formula->_connective + lVar1);
      break;
    case NOT:
      goto switchD_00623451_caseD_6;
    case FORALL:
    case EXISTS:
      collectBoundVariables(this,(Formula *)formula[1]._label._M_string_length);
      Lib::List<unsigned_int>::pushFromIterator<Lib::List<unsigned_int>::Iterator>
                (*(List<unsigned_int> **)(formula + 1),&this->_bound);
      return;
    case BOOL_TERM:
      collectBoundVariables(this,(TermList)*(uint64_t *)(formula + 1));
      return;
    default:
      return;
    }
  } while( true );
}

Assistant:

void SymbolDefinitionInlining::collectBoundVariables(Formula* formula) {
  switch (formula->connective()) {
    case FORALL:
    case EXISTS: {
      collectBoundVariables(formula->qarg());
      VList::Iterator vit(formula->vars());
      VList::pushFromIterator(vit, _bound);
      break;
    }

    case AND:
    case OR: {
      List<Formula*>::Iterator fit(formula->args());
      while (fit.hasNext()) {
        collectBoundVariables(fit.next());
      }
      break;
    }

    case NOT: {
      collectBoundVariables(formula->uarg());
      break;
    }

    case IMP:
    case IFF:
    case XOR: {
      collectBoundVariables(formula->left());
      collectBoundVariables(formula->right());
      break;
    }

    case BOOL_TERM: {
      collectBoundVariables(formula->getBooleanTerm());
      break;
    }

    case LITERAL: {
      collectBoundVariables(formula->literal());
      break;
    }

    default:
      break;
  }
}